

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O1

void __thiscall gimage::PNMImageIO::save(PNMImageIO *this,ImageU16 *image,char *name)

{
  unsigned_short uVar1;
  int iVar2;
  IOException *this_00;
  long *plVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  undefined1 uVar6;
  long lVar7;
  long lVar8;
  string type;
  ofstream out;
  undefined1 auStack_278 [7];
  allocator local_271;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined1 local_230 [8];
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  int aiStack_210 [4];
  undefined1 *local_200;
  undefined1 *local_1f8;
  ios_base local_138 [264];
  
  iVar2 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,0);
  if (((char)iVar2 == '\0') || ((image->depth | 2U) != 3)) {
    this_00 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_250,name,&local_271);
    std::operator+(&local_270,"Can only save PNM images with depth 1 or 3 (",&local_250);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_270);
    local_230 = (undefined1  [8])*plVar3;
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar3 + 2);
    if (local_230 == (undefined1  [8])paVar4) {
      local_220._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_220._8_8_ = plVar3[3];
      local_230 = (undefined1  [8])&local_220;
    }
    else {
      local_220._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    local_228 = plVar3[1];
    *plVar3 = (long)paVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    gutil::IOException::IOException(this_00,(string *)local_230);
    __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"P5","");
  if (image->depth == 3) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_270,0,(char *)local_270._M_string_length,0x150b22);
  }
  anon_unknown_11::writePNMHeader
            (name,local_270._M_dataplus._M_p,image->width,image->height,0xffff,0.0);
  std::ofstream::ofstream(local_230);
  lVar8 = *(long *)((long)local_230 + -0x18);
  *(undefined4 *)((long)aiStack_210 + lVar8 + -4) = 5;
  std::ios::clear((int)auStack_278 + (int)lVar8 + 0x48);
  std::ofstream::open(local_230,(_Ios_Openmode)name);
  if (0 < image->height) {
    lVar8 = 0;
    do {
      if (*(int *)((long)aiStack_210 + *(long *)((long)local_230 + -0x18)) != 0) break;
      if (0 < image->width) {
        lVar7 = 0;
        do {
          if (0 < image->depth) {
            lVar5 = 0;
            do {
              uVar1 = image->img[lVar5][lVar8][lVar7];
              if (local_200 < local_1f8) {
                *local_200 = (char)(uVar1 >> 8);
                local_200 = local_200 + 1;
              }
              else {
                (**(code **)(local_228 + 0x68))((filebuf *)&local_228);
              }
              uVar6 = (undefined1)uVar1;
              if (local_200 < local_1f8) {
                *local_200 = uVar6;
                local_200 = local_200 + 1;
              }
              else {
                (**(code **)(local_228 + 0x68))((filebuf *)&local_228,uVar6);
              }
              lVar5 = lVar5 + 1;
            } while (lVar5 < image->depth);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < image->width);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < image->height);
  }
  std::ofstream::close();
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  return;
}

Assistant:

void PNMImageIO::save(const ImageU16 &image, const char *name) const
{
  if (!handlesFile(name, false) || (image.getDepth() != 1 && image.getDepth() != 3))
  {
    throw gutil::IOException("Can only save PNM images with depth 1 or 3 ("+std::string(name)+")");
  }

  std::string type="P5";

  if (image.getDepth() == 3)
  {
    type="P6";
  }

  writePNMHeader(name, type.c_str(), image.getWidth(), image.getHeight(),
                 65535, 0);

  try
  {
    std::ofstream out;
    out.exceptions(std::ios_base::failbit | std::ios_base::badbit);
    out.open(name, std::ios::binary|std::ios::app);

    std::streambuf *sb=out.rdbuf();

    for (long k=0; k<image.getHeight() && out.good(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        for (int j=0; j<image.getDepth(); j++)
        {
          ImageU16::store_t p=image.get(i, k, j);

          sb->sputc(static_cast<char>((p>>8)&0xff));
          sb->sputc(static_cast<char>(p&0xff));
        }
      }
    }

    out.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }
}